

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall script_tests::script_HasValidOps::test_method(script_HasValidOps *this)

{
  readonly_property65 rVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar5;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  assertion_result local_98;
  undefined1 uStack_80;
  uchar local_7f [7];
  undefined1 local_78 [28];
  uint uStack_5c;
  undefined1 local_58 [28];
  size_type sStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_4_ = 0;
  local_58._20_4_ = 0;
  local_58._24_4_ = 0;
  sStack_3c = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_98.m_message.pn.pi_._0_1_ = 0xa6;
  local_98.m_message.pn.pi_._1_7_ = 0x88abaaa0a9a8a7;
  uStack_80 = 0xac;
  local_98._0_8_ = 0x907856341214a976;
  local_98.m_message.px._0_1_ = 0xab;
  local_98.m_message.px._1_7_ = 0xa5a4a3a2a1efcd;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(uchar *)&local_98,
             local_7f);
  local_58._0_8_ = local_78._0_8_;
  sStack_3c = uStack_5c;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5cd;
  file.m_begin = (iterator)&local_a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::HasValidOps((CScript *)local_58);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_98.m_message.px._0_1_ = 0;
  local_98.m_message.px._1_7_ = 0;
  local_98.m_message.pn.pi_._0_1_ = 0;
  local_98.m_message.pn.pi_._1_7_ = 0;
  unique0x00005300 = &local_c8;
  local_c8 = "script.HasValidOps()";
  local_c0 = "";
  local_78._8_4_ = local_78._8_4_ & 0xffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_78._16_4_ = 0x13c2138;
  local_78._20_4_ = 0;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_d0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar5,(size_t)&local_d8,0x5cd);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  local_98.m_message.pn.pi_._0_1_ = 0xa6;
  local_98.m_message.pn.pi_._1_7_ = 0x88abaaa0a9a8a7;
  uStack_80 = 0xac;
  local_98._0_8_ = 0x90785634ff14a976;
  local_98.m_message.px._0_1_ = 0xab;
  local_98.m_message.px._1_7_ = 0xa5a4a3a2a1efcd;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(uchar *)&local_98,
             local_7f);
  if (0x1c < sStack_3c) {
    free((void *)local_58._0_8_);
  }
  local_58._16_4_ = local_78._16_4_;
  local_58._20_4_ = local_78._20_4_;
  local_58._0_8_ = local_78._0_8_;
  local_58._8_4_ = local_78._8_4_;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5cf;
  file_00.m_begin = (iterator)&local_e8;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  unique0x10000b84 = unique0x100008a4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f8,msg_00
            );
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::HasValidOps((CScript *)local_58);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_98.m_message.px._0_1_ = 0;
  local_98.m_message.px._1_7_ = 0;
  local_98.m_message.pn.pi_._0_1_ = 0;
  local_98.m_message.pn.pi_._1_7_ = 0;
  local_c8 = "script.HasValidOps()";
  local_c0 = "";
  local_78._8_4_ = local_78._8_4_ & 0xffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_78._16_4_ = 0x13c2138;
  local_78._20_4_ = 0;
  unique0x00005300 = &local_c8;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_100 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar5,(size_t)&local_108,0x5cf);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  local_98._0_3_ = 0xac0000;
  local_98._0_2_ = 0x88ff;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(uchar *)&local_98,
             &local_98.field_0x3);
  if ((char **)0x1cffffffff < stack0xffffffffffffffc0) {
    free((void *)local_58._0_8_);
  }
  local_58._16_4_ = local_78._16_4_;
  local_58._20_4_ = local_78._20_4_;
  local_58._0_8_ = local_78._0_8_;
  local_58._8_4_ = local_78._8_4_;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5d1;
  file_01.m_begin = (iterator)&local_118;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  unique0x10000b8c = unique0x100008b4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_128,
             msg_01);
  bVar2 = CScript::HasValidOps((CScript *)local_58);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_98.m_message.px._0_1_ = 0;
  local_98.m_message.px._1_7_ = 0;
  local_98.m_message.pn.pi_._0_1_ = 0;
  local_98.m_message.pn.pi_._1_7_ = 0;
  local_c8 = "!script.HasValidOps()";
  local_c0 = "";
  local_78._8_4_ = local_78._8_4_ & 0xffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_78._16_4_ = 0x13c2138;
  local_78._20_4_ = 0;
  unique0x00005300 = &local_c8;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_130 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar5,(size_t)&local_138,0x5d1);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  local_98._0_3_ = 0xc00000;
  local_98._0_2_ = 0xac88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(uchar *)&local_98,
             &local_98.field_0x3);
  if ((char **)0x1cffffffff < stack0xffffffffffffffc0) {
    free((void *)local_58._0_8_);
  }
  local_58._16_4_ = local_78._16_4_;
  local_58._20_4_ = local_78._20_4_;
  local_58._0_8_ = local_78._0_8_;
  local_58._8_4_ = local_78._8_4_;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5d3;
  file_02.m_begin = (iterator)&local_148;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  unique0x10000b94 = unique0x100008c4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  bVar2 = CScript::HasValidOps((CScript *)local_58);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_98.m_message.px._0_1_ = 0;
  local_98.m_message.px._1_7_ = 0;
  local_98.m_message.pn.pi_._0_1_ = 0;
  local_98.m_message.pn.pi_._1_7_ = 0;
  local_c8 = "!script.HasValidOps()";
  local_c0 = "";
  local_78._8_4_ = local_78._8_4_ & 0xffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_78._16_4_ = 0x13c2138;
  local_78._20_4_ = 0;
  unique0x00005300 = &local_c8;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_160 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar5,(size_t)&local_168,0x5d3);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  if ((char **)0x1cffffffff < stack0xffffffffffffffc0) {
    free((void *)local_58._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_HasValidOps)
{
    // Exercise the HasValidOps functionality
    CScript script;
    script = ToScript("76a9141234567890abcdefa1a2a3a4a5a6a7a8a9a0aaab88ac"_hex); // Normal script
    BOOST_CHECK(script.HasValidOps());
    script = ToScript("76a914ff34567890abcdefa1a2a3a4a5a6a7a8a9a0aaab88ac"_hex);
    BOOST_CHECK(script.HasValidOps());
    script = ToScript("ff88ac"_hex); // Script with OP_INVALIDOPCODE explicit
    BOOST_CHECK(!script.HasValidOps());
    script = ToScript("88acc0"_hex); // Script with undefined opcode
    BOOST_CHECK(!script.HasValidOps());
}